

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformparser.cpp
# Opt level: O1

mat4f * parseTransform(mat4f *__return_storage_ptr__,Json *conf)

{
  json_value jVar1;
  bool bVar2;
  int i;
  const_reference pvVar3;
  long lVar4;
  undefined8 *puVar5;
  float *pfVar6;
  long lVar7;
  long lVar8;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *other;
  float fVar9;
  float fVar10;
  vec3f vVar11;
  const_iterator result;
  vector<float,_std::allocator<float>_> v;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_f8;
  undefined8 local_d8;
  float local_d0;
  undefined8 local_cc;
  undefined8 uStack_c4;
  undefined4 local_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  const_iterator local_a8;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float local_58;
  float local_48;
  float local_38;
  
  if (conf->m_type == array) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get<std::vector<float,_std::allocator<float>_>,_std::vector<float,_std::allocator<float>_>,_0>
              ((vector<float,_std::allocator<float>_> *)&local_a8,conf);
    if ((long)local_a8.m_it.object_iterator._M_node - (long)local_a8.m_object != 0x40) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = "bad transformation matrix";
      __cxa_throw(puVar5,&char_const*::typeinfo,0);
    }
    jVar1 = (local_a8.m_object)->m_value;
    *(undefined8 *)__return_storage_ptr__->data[0] = *(undefined8 *)local_a8.m_object;
    *(json_value *)(__return_storage_ptr__->data[0] + 2) = jVar1;
    jVar1 = local_a8.m_object[1].m_value;
    *(undefined8 *)__return_storage_ptr__->data[1] = *(undefined8 *)(local_a8.m_object + 1);
    *(json_value *)(__return_storage_ptr__->data[1] + 2) = jVar1;
    jVar1 = local_a8.m_object[2].m_value;
    *(undefined8 *)__return_storage_ptr__->data[2] = *(undefined8 *)(local_a8.m_object + 2);
    *(json_value *)(__return_storage_ptr__->data[2] + 2) = jVar1;
    jVar1 = local_a8.m_object[3].m_value;
    *(undefined8 *)__return_storage_ptr__->data[3] = *(undefined8 *)(local_a8.m_object + 3);
    *(json_value *)(__return_storage_ptr__->data[3] + 2) = jVar1;
    operator_delete(local_a8.m_object,
                    (long)local_a8.m_it.array_iterator._M_current - (long)local_a8.m_object);
  }
  else {
    *(float *)((long)(__return_storage_ptr__->data + 3) + 0) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 3) + 4) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 3) + 8) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 3) + 0xc) = 1.0;
    *(float *)((long)(__return_storage_ptr__->data + 2) + 0) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 2) + 4) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 2) + 8) = 1.0;
    *(float *)((long)(__return_storage_ptr__->data + 2) + 0xc) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 1) + 0) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 1) + 4) = 1.0;
    *(float *)((long)(__return_storage_ptr__->data + 1) + 8) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 1) + 0xc) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 0) + 0) = 1.0;
    *(float *)((long)(__return_storage_ptr__->data + 0) + 4) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 0) + 8) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 0) + 0xc) = 0.0;
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[6]>
              (&local_a8,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)conf,(char (*) [6])"scale");
    local_f8.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_f8.m_it.array_iterator._M_current = (pointer)0x0;
    local_f8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (conf->m_type == array) {
      local_f8.m_it.array_iterator._M_current =
           (((conf->m_value).array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (conf->m_type == object) {
      local_f8.m_it.object_iterator._M_node =
           &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_f8.m_it.primitive_iterator.m_it = 1;
    }
    local_f8.m_object = conf;
    bVar2 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator==(&local_a8,&local_f8);
    if (!bVar2) {
      pvVar3 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)conf,"scale");
      vVar11 = json2vec3f(pvVar3);
      __return_storage_ptr__->data[0][0] = vVar11.x;
      __return_storage_ptr__->data[1][1] = vVar11.y;
      __return_storage_ptr__->data[2][2] = vVar11.z;
    }
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[9]>
              (&local_a8,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)conf,(char (*) [9])"rotation");
    local_f8.m_it.primitive_iterator.m_it = 0x8000000000000000;
    local_f8.m_it.array_iterator._M_current = (pointer)0x0;
    local_f8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (conf->m_type == array) {
      local_f8.m_it.array_iterator._M_current =
           (((conf->m_value).array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (conf->m_type == object) {
      local_f8.m_it.object_iterator._M_node =
           &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_f8.m_it.primitive_iterator.m_it = 1;
    }
    other = &local_f8;
    local_f8.m_object = conf;
    bVar2 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator==(&local_a8,other);
    if (!bVar2) {
      pvVar3 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)conf,"rotation");
      vVar11 = json2vec3f(pvVar3);
      fStack_b4 = vVar11.y;
      local_68 = (vVar11.x * 3.1415927) / 180.0;
      local_b8 = (fStack_b4 * 3.1415927) / 180.0;
      fVar10 = (vVar11.z * 3.1415927) / 180.0;
      fStack_b0 = fStack_b4;
      fStack_ac = fStack_b4;
      fStack_64 = fStack_b4;
      local_48 = cosf(local_68);
      local_58 = cosf(local_b8);
      local_38 = cosf(fVar10);
      local_68 = sinf(local_68);
      local_b8 = sinf(local_b8);
      fVar10 = sinf(fVar10);
      fVar9 = -local_b8;
      local_f8.m_object =
           (Json *)CONCAT44(-local_58 * fVar10 + local_68 * fVar9 * local_38,
                            local_58 * local_38 + local_68 * fVar9 * fVar10);
      lVar4 = 0;
      local_f8.m_it.object_iterator._M_node._4_4_ = 0;
      local_f8.m_it.object_iterator._M_node._0_4_ = local_48 * fVar9;
      local_f8.m_it.array_iterator._M_current =
           (pointer)CONCAT44(local_48 * local_38,local_48 * fVar10);
      local_f8.m_it.primitive_iterator.m_it._4_4_ = 0;
      local_f8.m_it.primitive_iterator.m_it._0_4_ = -local_68;
      local_d8 = CONCAT44(fVar9 * fVar10 + local_68 * local_58 * local_38,
                          local_b8 * local_38 + local_68 * local_58 * fVar10);
      local_d0 = local_48 * local_58;
      local_cc = 0;
      uStack_c4 = 0;
      local_bc = 0x3f800000;
      local_a8.m_object = (pointer)0x0;
      local_a8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
      local_a8.m_it.array_iterator._M_current =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)0x0;
      local_a8.m_it.primitive_iterator.m_it = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_78 = 0;
      uStack_70 = 0;
      do {
        lVar7 = 0;
        pfVar6 = (float *)__return_storage_ptr__;
        do {
          fVar10 = *(float *)((long)&local_a8.m_object + lVar7 * 4 + lVar4 * 0x10);
          lVar8 = 0;
          do {
            fVar10 = fVar10 + *(float *)((long)&other->m_object + lVar8) * pfVar6[lVar8];
            lVar8 = lVar8 + 4;
          } while (lVar8 != 0x10);
          *(float *)((long)&local_a8.m_object + lVar7 * 4 + lVar4 * 0x10) = fVar10;
          lVar7 = lVar7 + 1;
          pfVar6 = pfVar6 + 1;
        } while (lVar7 != 4);
        lVar4 = lVar4 + 1;
        other = (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)&(other->m_it).array_iterator;
      } while (lVar4 != 4);
      *(undefined8 *)__return_storage_ptr__->data[3] = local_78;
      *(undefined8 *)(__return_storage_ptr__->data[3] + 2) = uStack_70;
      *(undefined8 *)__return_storage_ptr__->data[2] = local_88;
      *(undefined8 *)(__return_storage_ptr__->data[2] + 2) = uStack_80;
      *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        **)__return_storage_ptr__->data[1] = local_a8.m_it.array_iterator._M_current;
      *(difference_type *)(__return_storage_ptr__->data[1] + 2) =
           local_a8.m_it.primitive_iterator.m_it;
      *(pointer *)__return_storage_ptr__->data[0] = local_a8.m_object;
      *(_Base_ptr *)(__return_storage_ptr__->data[0] + 2) = local_a8.m_it.object_iterator._M_node;
    }
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[9]>
              (&local_a8,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)conf,(char (*) [9])"position");
    local_f8.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_f8.m_it.array_iterator._M_current = (pointer)0x0;
    local_f8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (conf->m_type == array) {
      local_f8.m_it.array_iterator._M_current =
           (((conf->m_value).array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (conf->m_type == object) {
      local_f8.m_it.object_iterator._M_node =
           &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_f8.m_it.primitive_iterator.m_it = 1;
    }
    local_f8.m_object = conf;
    bVar2 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator==(&local_a8,&local_f8);
    if (!bVar2) {
      pvVar3 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)conf,"position");
      vVar11 = json2vec3f(pvVar3);
      __return_storage_ptr__->data[0][3] = vVar11.x;
      __return_storage_ptr__->data[1][3] = vVar11.y;
      __return_storage_ptr__->data[2][3] = vVar11.z;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

mat4f parseTransform(const Json& conf) {
	if (conf.type() == Json::value_t::array) {
		std::vector<float> v = conf;
		if (v.size() != 16)
			throw "bad transformation matrix";
		return mat4f(v[0],v[1],v[2],v[3],v[4],v[5],v[6],v[7],v[8],v[9],v[10],v[11],v[12],v[13],v[14],v[15]);
	}
	mat4f trans = mat4f::unit;
	if (conf.find("scale") != conf.end()) {
		vec3f scale = json2vec3f(conf["scale"]);
		trans[0][0] = scale.x;
		trans[1][1] = scale.y;
		trans[2][2] = scale.z;
	}
	if (conf.find("rotation") != conf.end()) {
		// in degrees
		trans = rotYXZ(json2vec3f(conf["rotation"])) * trans;
	}
	if (conf.find("position") != conf.end()) {
		vec3f offset = json2vec3f(conf["position"]);
		trans[0][3] = offset.x;
		trans[1][3] = offset.y;
		trans[2][3] = offset.z;
	}
	return trans;
}